

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::AddBonesToNodeGraph_3DGS_MDL7
          (MDLImporter *this,IntBone_MDL7 **apcBones,aiNode *pcParent,uint16_t iParentIndex)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  aiNode **ppaVar3;
  aiNode *paVar4;
  aiString local_470;
  aiNode *local_60;
  aiNode *pcNode;
  IntBone_MDL7 *pcBone_1;
  uint32_t i_1;
  uint qq;
  IntBone_MDL7 *pcBone;
  IntBone_MDL7 **ppIStack_38;
  uint32_t i;
  IntBone_MDL7 **apcBones2;
  Header_MDL7 *pcHeader;
  aiNode *paStack_20;
  uint16_t iParentIndex_local;
  aiNode *pcParent_local;
  IntBone_MDL7 **apcBones_local;
  MDLImporter *this_local;
  
  pcHeader._6_2_ = iParentIndex;
  paStack_20 = pcParent;
  pcParent_local = (aiNode *)apcBones;
  apcBones_local = (IntBone_MDL7 **)this;
  if (apcBones == (IntBone_MDL7 **)0x0 || pcParent == (aiNode *)0x0) {
    __assert_fail("__null != apcBones && __null != pcParent",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLLoader.cpp"
                  ,0x691,
                  "void Assimp::MDLImporter::AddBonesToNodeGraph_3DGS_MDL7(const MDL::IntBone_MDL7 **, aiNode *, uint16_t)"
                 );
  }
  apcBones2 = (IntBone_MDL7 **)this->mBuffer;
  ppIStack_38 = apcBones;
  for (pcBone._4_4_ = 0; pcBone._4_4_ < *(uint *)(apcBones2 + 1); pcBone._4_4_ = pcBone._4_4_ + 1) {
    _i_1 = *ppIStack_38;
    if (_i_1->iParent == (ulong)iParentIndex) {
      pcParent->mNumChildren = pcParent->mNumChildren + 1;
    }
    ppIStack_38 = ppIStack_38 + 1;
  }
  auVar1 = ZEXT416(pcParent->mNumChildren) * ZEXT816(8);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  ppaVar3 = (aiNode **)operator_new__(uVar2);
  paStack_20->mChildren = ppaVar3;
  pcBone_1._4_4_ = 0;
  for (pcBone_1._0_4_ = 0; (uint)pcBone_1 < *(uint *)(apcBones2 + 1);
      pcBone_1._0_4_ = (uint)pcBone_1 + 1) {
    paVar4 = (aiNode *)((pcParent_local->mName).data + 4);
    pcNode = *(aiNode **)&pcParent_local->mName;
    pcParent_local = paVar4;
    if (*(ulong *)&pcNode->mNumChildren == (ulong)pcHeader._6_2_) {
      paVar4 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar4);
      paStack_20->mChildren[pcBone_1._4_4_] = paVar4;
      local_60 = paVar4;
      pcBone_1._4_4_ = pcBone_1._4_4_ + 1;
      aiString::aiString(&local_470,&pcNode->mName);
      aiString::operator=(&local_60->mName,&local_470);
      AddBonesToNodeGraph_3DGS_MDL7
                (this,(IntBone_MDL7 **)pcParent_local,local_60,(uint16_t)(uint)pcBone_1);
    }
  }
  return;
}

Assistant:

void MDLImporter::AddBonesToNodeGraph_3DGS_MDL7(const MDL::IntBone_MDL7** apcBones,
    aiNode* pcParent,uint16_t iParentIndex)
{
    ai_assert(NULL != apcBones && NULL != pcParent);

    // get a pointer to the header ...
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)this->mBuffer;

    const MDL::IntBone_MDL7** apcBones2 = apcBones;
    for (uint32_t i = 0; i <  pcHeader->bones_num;++i)  {

        const MDL::IntBone_MDL7* const pcBone = *apcBones2++;
        if (pcBone->iParent == iParentIndex) {
            ++pcParent->mNumChildren;
        }
    }
    pcParent->mChildren = new aiNode*[pcParent->mNumChildren];
    unsigned int qq = 0;
    for (uint32_t i = 0; i <  pcHeader->bones_num;++i)  {

        const MDL::IntBone_MDL7* const pcBone = *apcBones++;
        if (pcBone->iParent != iParentIndex)continue;

        aiNode* pcNode = pcParent->mChildren[qq++] = new aiNode();
        pcNode->mName = aiString( pcBone->mName );

        AddBonesToNodeGraph_3DGS_MDL7(apcBones,pcNode,(uint16_t)i);
    }
}